

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_62210::AssertInt16Equals
               (uint16_t expected,char *s,ParseIntTypeCombo parse_type)

{
  ParseIntTypeCombo parse_type_local;
  char *s_local;
  uint16_t expected_local;
  
  (anonymous_namespace)::
  AssertIntEquals<unsigned_short,wabt::Result(&)(char_const*,char_const*,unsigned_short*,wabt::ParseIntType)>
            (expected,s,wabt::ParseInt16,parse_type);
  return;
}

Assistant:

void AssertInt16Equals(uint16_t expected,
                       const char* s,
                       ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt16, parse_type);
}